

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O1

void __thiscall
miniros::MasterLink::setParamImpl<bool>
          (MasterLink *this,string *key,vector<bool,_std::allocator<bool>_> *vec)

{
  XmlRpcValue *this_00;
  size_type __n;
  RpcValue xml_vec;
  bool local_41;
  XmlRpcValue local_40;
  
  local_40._type = TypeInvalid;
  local_40._value.asDouble = 0.0;
  XmlRpc::XmlRpcValue::assertArray
            (&local_40,(*(int *)(vec + 0x10) - *(int *)vec) * 8 + *(int *)(vec + 0x18));
  if ((*(long *)(vec + 0x10) - *(long *)vec) * 8 + (ulong)*(uint *)(vec + 0x18) != 0) {
    __n = 0;
    do {
      local_41 = std::vector<bool,_std::allocator<bool>_>::at(vec,__n);
      this_00 = XmlRpc::XmlRpcValue::operator[](&local_40,(int)__n);
      XmlRpc::XmlRpcValue::operator=(this_00,&local_41);
      __n = __n + 1;
    } while (__n < (ulong)*(uint *)(vec + 0x18) + (*(long *)(vec + 0x10) - *(long *)vec) * 8);
  }
  set(this,key,&local_40);
  XmlRpc::XmlRpcValue::invalidate(&local_40);
  return;
}

Assistant:

void MasterLink::setParamImpl(const std::string& key, const std::vector<T>& vec)
{
  // Note: the XmlRpcValue starts off as "invalid" and assertArray turns it
  // into an array type with the given size
  RpcValue xml_vec;
  xml_vec.setSize(vec.size());

  // Copy the contents into the XmlRpcValue
  for (size_t i = 0; i < vec.size(); i++) {
    xml_vec[i] = vec.at(i);
  }

  this->set(key, xml_vec);
}